

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmnhd(fitsfile *fptr,int exttype,char *hduname,int hduver,int *status)

{
  int iVar1;
  size_t sVar2;
  long local_b8;
  long extver;
  int chopped;
  int putback;
  int slen;
  int exact;
  int match;
  int tstatus;
  int extnum;
  int alttype;
  int hdutype;
  int ii;
  char extname [71];
  int *status_local;
  int hduver_local;
  char *hduname_local;
  int exttype_local;
  fitsfile *fptr_local;
  
  extver._4_4_ = 0;
  extver._0_4_ = 0;
  if (*status < 1) {
    match = fptr->HDUposition + 1;
    if (fptr->Fptr->only_one != 0) {
      sVar2 = strlen(hduname);
      chopped = (int)sVar2;
      if (hduname[chopped + -1] != '#') {
        extver._4_4_ = 1;
      }
    }
    alttype = 1;
    while( true ) {
      exact = 0;
      iVar1 = ffmahd(fptr,alttype,&extnum,&exact);
      if (iVar1 != 0) break;
      tstatus = -1;
      iVar1 = fits_is_compressed_image(fptr,status);
      if (iVar1 != 0) {
        tstatus = 2;
      }
      if (((exttype == -1) || (extnum == exttype)) || (extnum == tstatus)) {
        ffmaky(fptr,2,status);
        iVar1 = ffgkys(fptr,"EXTNAME",(char *)&hdutype,(char *)0x0,&exact);
        if (iVar1 < 1) {
          if (extver._4_4_ != 0) {
            extver._0_4_ = 0;
            sVar2 = strlen((char *)&hdutype);
            chopped = (int)sVar2;
            if (*(char *)((long)&hdutype + (long)(chopped + -1)) == '#') {
              *(undefined1 *)((long)&hdutype + (long)(chopped + -1)) = 0;
              extver._0_4_ = 1;
            }
          }
          ffcmps(hduname,(char *)&hdutype,0,&slen,&putback);
        }
        if ((exact != 0) || (putback == 0)) {
          exact = 0;
          iVar1 = ffgkys(fptr,"HDUNAME",(char *)&hdutype,(char *)0x0,&exact);
          if (iVar1 < 1) {
            if (extver._4_4_ != 0) {
              extver._0_4_ = 0;
              sVar2 = strlen((char *)&hdutype);
              chopped = (int)sVar2;
              if (*(char *)((long)&hdutype + (long)(chopped + -1)) == '#') {
                *(undefined1 *)((long)&hdutype + (long)(chopped + -1)) = 0;
                extver._0_4_ = 1;
              }
            }
            ffcmps(hduname,(char *)&hdutype,0,&slen,&putback);
          }
        }
        if ((exact == 0) && (putback != 0)) {
          if (hduver == 0) {
            if ((int)extver != 0) {
              fptr->Fptr->only_one = 0;
            }
            return *status;
          }
          iVar1 = ffgkyj(fptr,"EXTVER",&local_b8,(char *)0x0,&exact);
          if (0 < iVar1) {
            local_b8 = 1;
          }
          if ((int)local_b8 == hduver) {
            if ((int)extver != 0) {
              fptr->Fptr->only_one = 0;
            }
            return *status;
          }
        }
      }
      alttype = alttype + 1;
    }
    ffmahd(fptr,match,(int *)0x0,status);
    *status = 0x12d;
    fptr_local._4_4_ = 0x12d;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffmnhd(fitsfile *fptr,      /* I - FITS file pointer                    */
           int exttype,         /* I - desired extension type               */
           char *hduname,       /* I - desired EXTNAME value for the HDU    */
           int hduver,          /* I - desired EXTVERS value for the HDU    */
           int *status)         /* IO - error status                        */
/*
  Move to the next HDU with a given extension type (IMAGE_HDU, ASCII_TBL,
  BINARY_TBL, or ANY_HDU), extension name (EXTNAME or HDUNAME keyword),
  and EXTVERS keyword values.  If hduvers = 0, then move to the first HDU
  with the given type and name regardless of EXTVERS value.  If no matching
  HDU is found in the file, then the current open HDU will remain unchanged.
*/
{
    char extname[FLEN_VALUE];
    int ii, hdutype, alttype, extnum, tstatus, match, exact;
    int slen, putback = 0, chopped = 0;
    long extver;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */

    /*
       This is a kludge to deal with a special case where the
       user specified a hduname that ended with a # character, which
       CFITSIO previously interpreted as a flag to mean "don't copy any
       other HDUs in the file into the virtual file in memory.  If the
       remaining hduname does not end with a # character (meaning that
       the user originally entered a hduname ending in 2 # characters)
       then there is the possibility that the # character should be
       treated literally, if the actual EXTNAME also ends with a #.
       Setting putback = 1 means that we need to test for this case later on.
    */
        
    if ((fptr->Fptr)->only_one) {  /* if true, name orignally ended with a # */
       slen = strlen(hduname);
       if (hduname[slen - 1] != '#') /* This will fail if real EXTNAME value */
           putback = 1;              /*  ends with 2 # characters. */
    } 

    for (ii=1; 1; ii++)    /* loop over all HDUs until EOF */
    {
        tstatus = 0;
        if (ffmahd(fptr, ii, &hdutype, &tstatus))  /* move to next HDU */
        {
           ffmahd(fptr, extnum, 0, status); /* restore original file position */
           return(*status = BAD_HDU_NUM);   /* couldn't find desired HDU */
        }

        alttype = -1; 
        if (fits_is_compressed_image(fptr, status))
            alttype = BINARY_TBL;
        
        /* Does this HDU have a matching type? */
        if (exttype == ANY_HDU || hdutype == exttype || hdutype == alttype)
        {
          ffmaky(fptr, 2, status); /* reset to the 2nd keyword in the header */
          if (ffgkys(fptr, "EXTNAME", extname, 0, &tstatus) <= 0) /* get keyword */
          {
               if (putback) {          /* more of the kludge */
                   /* test if the EXTNAME value ends with a #;  if so, chop it  */
		   /* off before comparing the strings */
		   chopped = 0;
	           slen = strlen(extname);
		   if (extname[slen - 1] == '#') {
		       extname[slen - 1] = '\0'; 
                       chopped = 1;
                   }
               }

               /* see if the strings are an exact match */
               ffcmps(hduname, extname, CASEINSEN, &match, &exact);
          }

          /* if EXTNAME keyword doesn't exist, or it does not match, then try HDUNAME */
          if (tstatus || !exact)
	  {
               tstatus = 0;
               if (ffgkys(fptr, "HDUNAME", extname, 0, &tstatus) <= 0)
	       {
                   if (putback) {          /* more of the kludge */
		       chopped = 0;
	               slen = strlen(extname);
		       if (extname[slen - 1] == '#') {
		           extname[slen - 1] = '\0';  /* chop off the # */
                           chopped = 1;
                       }
                   }

                   /* see if the strings are an exact match */
                   ffcmps(hduname, extname, CASEINSEN, &match, &exact);
               }
          }

          if (!tstatus && exact)    /* found a matching name */
          {
             if (hduver)  /* need to check if version numbers match? */
             {
                if (ffgkyj(fptr, "EXTVER", &extver, 0, &tstatus) > 0)
                    extver = 1;  /* assume default EXTVER value */

                if ( (int) extver == hduver)
                {
                    if (chopped) {
                        /* The # was literally part of the name, not a flag */
	                (fptr->Fptr)->only_one = 0;  
                    }
                    return(*status);    /* found matching name and vers */
                }
             }
             else
             {
                 if (chopped) {
                     /* The # was literally part of the name, not a flag */
	            (fptr->Fptr)->only_one = 0;  
                 }
                 return(*status);    /* found matching name */
             }
          }  /* end of !tstatus && exact */

        }  /* end of matching HDU type */
    }  /* end of loop over HDUs */
}